

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O2

void sum_cols_int_check_nulls(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  int iVar4;
  int argc_local;
  sqlite3_context *local_d8;
  int local_cc;
  SourceLineInfo local_c8;
  BinaryExpr<const_int_&,_const_int_&> local_b8;
  AssertionHandler catchAssertionHandler;
  StringRef local_40;
  
  local_b8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1703ea;
  local_b8.super_ITransientExpression.m_isBinaryExpression = true;
  local_b8.super_ITransientExpression.m_result = false;
  local_b8.super_ITransientExpression._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 0x18;
  argc_local = argc;
  local_d8 = context;
  Catch::StringRef::StringRef(&local_40,"argc > 0");
  iVar2 = 1;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_cc = 0;
  local_c8.file = (char *)&argc_local;
  Catch::ExprLhs<int_const&>::operator>(&local_b8,(ExprLhs<int_const&> *)&local_c8,&local_cc);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_b8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_b8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  iVar4 = 0;
  for (lVar3 = 0; lVar3 < argc_local; lVar3 = lVar3 + 1) {
    iVar1 = duckdb_shell_sqlite3_value_type(argv[lVar3]);
    if (iVar1 == 5) {
      iVar2 = 5;
    }
    else {
      iVar1 = duckdb_shell_sqlite3_value_int(argv[lVar3]);
      iVar4 = iVar4 + iVar1;
    }
  }
  if (iVar2 == 5) {
    duckdb_shell_sqlite3_result_null(local_d8);
  }
  else {
    duckdb_shell_sqlite3_result_int(local_d8,iVar4);
  }
  return;
}

Assistant:

static void sum_cols_int_check_nulls(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	auto sum = 0;
	int res_type = SQLITE_INTEGER;
	for (int i = 0; i < argc; ++i) {
		int type = sqlite3_value_type(argv[i]);
		if (type == SQLITE_NULL) {
			res_type = SQLITE_NULL;
		} else {
			sum += sqlite3_value_int(argv[i]);
		}
	}
	if (res_type == SQLITE_NULL) {
		sqlite3_result_null(context);
	} else {
		sqlite3_result_int(context, sum);
	}
}